

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O3

void __thiscall Sandbox::onMouseDrag(Sandbox *this,float _x,float _y,int _button)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  _func_int **pp_Var9;
  Camera *pCVar10;
  float fVar11;
  float fVar12;
  uint extraout_XMM0_Da;
  float fVar13;
  float fVar14;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  ulong uVar15;
  undefined8 local_30;
  undefined4 local_28;
  
  if ((this->uniforms).super_Scene.activeCamera == (Camera *)0x0) {
    return;
  }
  if (this->quilt_resolution < 0) {
    vera::getPixelDensity(false);
    iVar8 = vera::getWindowWidth();
    if (_x <= 0.0) {
      fVar13 = (float)(iVar8 + -2);
    }
    else {
      fVar13 = _x;
      if ((float)iVar8 <= _x) {
        fVar13 = 2.0;
      }
    }
    iVar8 = vera::getWindowHeight();
    if (_y <= 0.0) {
      fVar14 = (float)(iVar8 + -2);
    }
    else {
      fVar14 = _y;
      if ((float)iVar8 <= _y) {
        fVar14 = 2.0;
      }
    }
    if ((fVar13 == _x) && (!NAN(fVar13) && !NAN(_x))) {
      if ((fVar14 == _y) && (!NAN(fVar14) && !NAN(_y))) goto LAB_001b916f;
    }
    vera::setMousePosition(fVar13,fVar14);
  }
LAB_001b916f:
  if (_button == 1) {
    fVar11 = vera::getMouseVelX();
    fVar12 = vera::getMouseVelY();
    fVar12 = -fVar12;
    fVar13 = (this->m_view2d).value[1].field_2.z;
    fVar14 = (this->m_view2d).value[0].field_2.z;
    uVar2 = (this->m_view2d).value[0].field_0;
    uVar5 = (this->m_view2d).value[0].field_1;
    uVar3 = (this->m_view2d).value[1].field_0;
    uVar6 = (this->m_view2d).value[1].field_1;
    uVar4 = (this->m_view2d).value[2].field_0;
    uVar7 = (this->m_view2d).value[2].field_1;
    fVar1 = (this->m_view2d).value[2].field_2.z;
    (this->m_view2d).value[2].field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
         ((float)uVar4 + (fVar12 * (float)uVar3 - fVar11 * (float)uVar2));
    (this->m_view2d).value[2].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         ((float)uVar7 + (fVar12 * (float)uVar6 - fVar11 * (float)uVar5));
    (this->m_view2d).value[2].field_2.z = (fVar13 * fVar12 - fVar14 * fVar11) + fVar1;
    (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
    fVar13 = vera::getMouseVelX();
    fVar14 = vera::getMouseVelY();
    if (50.0 <= ABS(fVar13)) {
      return;
    }
    if (50.0 <= ABS(fVar14)) {
      return;
    }
    fVar13 = this->m_camera_azimuth - fVar13;
    this->m_camera_azimuth = fVar13;
    fVar14 = fVar14 * -0.5 + this->m_camera_elevation;
    this->m_camera_elevation = fVar14;
    pCVar10 = (this->uniforms).super_Scene.activeCamera;
    pp_Var9 = (pCVar10->super_Node)._vptr_Node;
    uVar15 = (ulong)extraout_XMM0_Da;
  }
  else {
    (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
    fVar13 = vera::getMouseVelY();
    fVar13 = fVar13 * -0.008 + extraout_XMM0_Da_00;
    uVar15 = CONCAT44(extraout_XMM0_Db,fVar13);
    if (fVar13 <= 0.0) {
      return;
    }
    pCVar10 = (this->uniforms).super_Scene.activeCamera;
    fVar13 = this->m_camera_azimuth;
    fVar14 = this->m_camera_elevation;
    pp_Var9 = (pCVar10->super_Node)._vptr_Node;
  }
  local_28 = 0;
  local_30 = 0;
  (*pp_Var9[0x29])(fVar13,(ulong)(uint)fVar14,uVar15,pCVar10,&local_30);
  pCVar10 = (this->uniforms).super_Scene.activeCamera;
  local_30 = 0;
  local_28 = 0;
  (*(pCVar10->super_Node)._vptr_Node[0x30])(0,0,pCVar10,&local_30);
  return;
}

Assistant:

void Sandbox::onMouseDrag(float _x, float _y, int _button) {
    if (uniforms.activeCamera == nullptr)
        return;

    if (quilt_resolution < 0) {
        // If it's not playing on the HOLOPLAY
        // produce continue draging like blender
        //
        float x = _x;
        float y = _y;
        float pd = vera::getPixelDensity();

        if (x <= 0) x = vera::getWindowWidth() - 2;
        else if (x >= vera::getWindowWidth()) x = 2; 

        if (y <= 0) y = vera::getWindowHeight() - 2;
        else if (y >= vera::getWindowHeight()) y = 2;

        if (x != _x || y != _y) vera::setMousePosition(x, y);
    }

    if (_button == 1) {
        // Left-button drag is used to pan u_view2d.
        m_view2d = glm::translate(m_view2d, glm::vec2(-vera::getMouseVelX(),-vera::getMouseVelY()) );

        // Left-button drag is used to rotate geometry.
        float dist = uniforms.activeCamera->getDistance();

        float vel_x = vera::getMouseVelX();
        float vel_y = vera::getMouseVelY();

        if (fabs(vel_x) < 50.0 && fabs(vel_y) < 50.0) {
            m_camera_azimuth -= vel_x;
            m_camera_elevation -= vel_y * 0.5;
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    } 
    else {
        // Right-button drag is used to zoom geometry.
        float dist = uniforms.activeCamera->getDistance();
        dist += (-.008f * vera::getMouseVelY());
        if (dist > 0.0f) {
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    }
}